

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O1

void duckdb::
     LeastGreatestFunction<duckdb::hugeint_t,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  reference pvVar5;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  size_type sVar9;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  long *local_880;
  long local_878;
  long local_870;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_860;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_840;
  bool local_838 [2056];
  
  if (*(long *)(args + 8) - *(long *)args == 0x68) {
    vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
    duckdb::Vector::Reference(result);
    return;
  }
  if (*(long *)(args + 8) != *(long *)args) {
    sVar9 = 0;
    do {
      vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,sVar9);
      sVar9 = sVar9 + 1;
    } while (sVar9 < (ulong)((*(long *)(args + 8) - *(long *)args >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  lVar1 = *(long *)(result + 0x20);
  memset(local_838,0,0x800);
  if (*(long *)(args + 8) != *(long *)args) {
    sVar9 = 0;
    do {
      pvVar5 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,sVar9);
      if (*pvVar5 == (value_type)0x2) {
        pvVar5 = vector<duckdb::Vector,_true>::operator[]
                           ((vector<duckdb::Vector,_true> *)args,sVar9);
        if ((*(byte **)(pvVar5 + 0x28) == (byte *)0x0) || ((**(byte **)(pvVar5 + 0x28) & 1) != 0))
        goto LAB_00678527;
      }
      else {
LAB_00678527:
        duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_880);
        pvVar5 = vector<duckdb::Vector,_true>::operator[]
                           ((vector<duckdb::Vector,_true> *)args,sVar9);
        duckdb::Vector::ToUnifiedFormat((ulong)pvVar5,*(UnifiedVectorFormat **)(args + 0x18));
        if (local_870 == 0) {
          if (*(long *)(args + 0x18) != 0) {
            lVar2 = *local_880;
            uVar7 = 0;
            plVar6 = (long *)(lVar1 + 8);
            do {
              uVar8 = uVar7;
              if (lVar2 != 0) {
                uVar8 = (ulong)*(uint *)(lVar2 + uVar7 * 4);
              }
              uVar3 = *(ulong *)(local_878 + uVar8 * 0x10);
              lVar4 = *(long *)(local_878 + 8 + uVar8 * 0x10);
              if (local_838[uVar7] == true) {
                if ((lVar4 < *plVar6) || (uVar3 < (ulong)plVar6[-1] && *plVar6 == lVar4))
                goto LAB_0067862a;
              }
              else {
LAB_0067862a:
                local_838[uVar7] = true;
                plVar6[-1] = uVar3;
                *plVar6 = lVar4;
              }
              uVar7 = uVar7 + 1;
              plVar6 = plVar6 + 2;
            } while (uVar7 < *(ulong *)(args + 0x18));
          }
        }
        else if (*(long *)(args + 0x18) != 0) {
          lVar2 = *local_880;
          uVar7 = 0;
          plVar6 = (long *)(lVar1 + 8);
          do {
            uVar8 = uVar7;
            if (lVar2 != 0) {
              uVar8 = (ulong)*(uint *)(lVar2 + uVar7 * 4);
            }
            if ((*(ulong *)(local_870 + (uVar8 >> 6) * 8) >> (uVar8 & 0x3f) & 1) != 0) {
              uVar3 = *(ulong *)(local_878 + uVar8 * 0x10);
              lVar4 = *(long *)(local_878 + 8 + uVar8 * 0x10);
              if (local_838[uVar7] == true) {
                if ((*plVar6 <= lVar4) && ((ulong)plVar6[-1] <= uVar3 || *plVar6 != lVar4))
                goto LAB_006785cc;
              }
              local_838[uVar7] = true;
              plVar6[-1] = uVar3;
              *plVar6 = lVar4;
            }
LAB_006785cc:
            uVar7 = uVar7 + 1;
            plVar6 = plVar6 + 2;
          } while (uVar7 < *(ulong *)(args + 0x18));
        }
        if (local_840 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_840);
        }
        if (local_860 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_860);
        }
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 < (ulong)((*(long *)(args + 8) - *(long *)args >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  StandardLeastGreatest<false>::FinalizeResult(*(idx_t *)(args + 0x18),local_838,result,state);
  duckdb::Vector::SetVectorType((VectorType)result);
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}